

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

mem_hash_record *
MemHashNewRecord(mem_hash_kv_engine *pEngine,void *pKey,int nKey,void *pData,unqlite_int64 nData,
                sxu32 nHash)

{
  SyMemBackend *pBackend;
  void *pDest;
  SyMemMethods *pDest_00;
  char *zPtr;
  sxu32 nByte;
  void *pDupData;
  mem_hash_record *pRecord;
  SyMemBackend *pAlloc;
  sxu32 nHash_local;
  unqlite_int64 nData_local;
  void *pData_local;
  int nKey_local;
  void *pKey_local;
  mem_hash_kv_engine *pEngine_local;
  
  pBackend = &pEngine->sAlloc;
  pEngine_local = (mem_hash_kv_engine *)SyMemBackendAlloc(pBackend,nKey + 0x50);
  if (pEngine_local == (mem_hash_kv_engine *)0x0) {
    pEngine_local = (mem_hash_kv_engine *)0x0;
  }
  else {
    pDest = SyMemBackendAlloc(pBackend,(sxu32)nData);
    if (pDest == (void *)0x0) {
      SyMemBackendFree(pBackend,pEngine_local);
      pEngine_local = (mem_hash_kv_engine *)0x0;
    }
    else {
      pDest_00 = (SyMemMethods *)((pEngine_local->sAlloc).apPool + 1);
      SyZero(pEngine_local,0x50);
      pEngine_local->pIo = (unqlite_kv_io *)pEngine;
      *(sxu32 *)&(pEngine_local->sAlloc).xMemError = (sxu32)nData;
      *(int *)&(pEngine_local->sAlloc).pBlocks = nKey;
      *(sxu32 *)&(pEngine_local->sAlloc).pMutexMethods = nHash;
      SyMemcpy(pKey,pDest_00,*(sxu32 *)&(pEngine_local->sAlloc).pBlocks);
      (pEngine_local->sAlloc).pMethods = pDest_00;
      SyMemcpy(pData,pDest,*(sxu32 *)&(pEngine_local->sAlloc).xMemError);
      *(void **)&(pEngine_local->sAlloc).nBlock = pDest;
    }
  }
  return (mem_hash_record *)pEngine_local;
}

Assistant:

static mem_hash_record * MemHashNewRecord(
	mem_hash_kv_engine *pEngine,
	const void *pKey,int nKey,
	const void *pData,unqlite_int64 nData,
	sxu32 nHash
	)
{
	SyMemBackend *pAlloc = &pEngine->sAlloc;
	mem_hash_record *pRecord;
	void *pDupData;
	sxu32 nByte;
	char *zPtr;
	
	/* Total number of bytes to alloc */
	nByte = sizeof(mem_hash_record) + nKey;
	/* Allocate a new instance */
	pRecord = (mem_hash_record *)SyMemBackendAlloc(pAlloc,nByte);
	if( pRecord == 0 ){
		return 0;
	}
	pDupData = (void *)SyMemBackendAlloc(pAlloc,(sxu32)nData);
	if( pDupData == 0 ){
		SyMemBackendFree(pAlloc,pRecord);
		return 0;
	}
	zPtr = (char *)pRecord;
	zPtr += sizeof(mem_hash_record);
	/* Zero the structure */
	SyZero(pRecord,sizeof(mem_hash_record));
	/* Fill in the structure */
	pRecord->pEngine = pEngine;
	pRecord->nDataLen = (sxu32)nData;
	pRecord->nKeyLen = (sxu32)nKey;
	pRecord->nHash = nHash;
	SyMemcpy(pKey,zPtr,pRecord->nKeyLen);
	pRecord->pKey = (const void *)zPtr;
	SyMemcpy(pData,pDupData,pRecord->nDataLen);
	pRecord->pData = pDupData;
	/* All done */
	return pRecord;
}